

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetTapBranchHandle
              (void *handle,void *tree_handle,uint8_t index_from_leaf,char **branch_hash,
              void **branch_tree_handle)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  reference pvVar2;
  reference this_00;
  char *pcVar3;
  void *pvVar4;
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *this_01;
  undefined8 *puVar5;
  CfdException *pCVar6;
  allocator local_101;
  void *local_100;
  char *work_branch_hash;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  ByteData256 hash_obj;
  TaprootScriptTree tree;
  
  work_branch_hash = (char *)0x0;
  local_100 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&tree,"TapscriptTree",(allocator *)&branches);
  cfd::capi::CheckBuffer(tree_handle,(string *)&tree);
  std::__cxx11::string::~string((string *)&tree);
  if (branch_tree_handle == (void **)0x0) {
    tree.super_TapBranch._vptr_TapBranch = (_func_int **)0x4fb1b0;
    tree.super_TapBranch.has_leaf_ = true;
    tree.super_TapBranch.leaf_version_ = '\x03';
    tree.super_TapBranch._10_2_ = 0;
    tree.super_TapBranch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a968;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tree,"branch_tree_handle is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tree,"Failed to parameter. branch_tree_handle is null or empty.",
               (allocator *)&branches);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tree);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
          ((long)tree_handle + 0x18);
  if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    pvVar2 = std::
             vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::at
                       (*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                          **)((long)tree_handle + 0x10),0);
  }
  else {
    pvVar2 = (reference)
             std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
  }
  cfd::core::TapBranch::GetBranchList(&branches,&pvVar2->super_TapBranch);
  if ((uint)index_from_leaf <
      (uint)(((long)branches.
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)branches.
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x78)) {
    this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                        (&branches,(ulong)index_from_leaf);
    cfd::core::TapBranch::GetCurrentBranchHash(&hash_obj,this_00);
    if (branch_hash == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&tree,&hash_obj);
      pcVar3 = cfd::capi::CreateString((string *)&tree);
      work_branch_hash = pcVar3;
      std::__cxx11::string::~string((string *)&tree);
    }
    std::__cxx11::string::string((string *)&tree,"TapscriptTree",&local_101);
    pvVar4 = cfd::capi::AllocBuffer((string *)&tree,0x20);
    std::__cxx11::string::~string((string *)&tree);
    this_01 = (vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *
              )operator_new(0x18);
    std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::vector
              (this_01,1,(allocator_type *)&tree);
    *(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> **)
     ((long)pvVar4 + 0x10) = this_01;
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = 0;
    puVar5[1] = 0;
    puVar5[2] = 0;
    *(undefined8 **)((long)pvVar4 + 0x18) = puVar5;
    bVar1 = cfd::core::TapBranch::HasTapLeaf(this_00);
    if (bVar1) {
      cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,this_00);
      pvVar2 = std::
               vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
               at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                    **)((long)pvVar4 + 0x10),0);
      cfd::core::TaprootScriptTree::operator=(pvVar2,&tree);
      cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
    }
    else {
      std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
      emplace_back<cfd::core::TapBranch&>
                (*(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
                  ((long)pvVar4 + 0x18),this_00);
    }
    *branch_tree_handle = pvVar4;
    if (branch_hash != (char **)0x0) {
      *branch_hash = pcVar3;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_obj);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&branches);
    return 0;
  }
  tree.super_TapBranch._vptr_TapBranch = (_func_int **)0x4fb1b0;
  tree.super_TapBranch.has_leaf_ = true;
  tree.super_TapBranch.leaf_version_ = '\x03';
  tree.super_TapBranch._10_2_ = 0;
  tree.super_TapBranch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a968;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tree,"index_from_leaf is out of range.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tree,"Failed to parameter. index_from_leaf is out of range.",
             (allocator *)&hash_obj);
  cfd::core::CfdException::CfdException(pCVar6,kCfdOutOfRangeError,(string *)&tree);
  __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTapBranchHandle(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    char** branch_hash, void** branch_tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_branch_hash = nullptr;
  CfdCapiTapscriptTree* work_branch_buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (branch_tree_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "branch_tree_handle is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_tree_handle is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    TapBranch& branch_data = branches.at(index_from_leaf);
    ByteData256 hash_obj = branch_data.GetCurrentBranchHash();
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    work_branch_buffer = static_cast<CfdCapiTapscriptTree*>(
        AllocBuffer(kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree)));
    work_branch_buffer->tree_buffer = new std::vector<TaprootScriptTree>(1);
    work_branch_buffer->branch_buffer = new std::vector<TapBranch>();
    if (branch_data.HasTapLeaf()) {
      TaprootScriptTree tree(branch_data);
      auto& dest_tree = work_branch_buffer->tree_buffer->at(0);
      dest_tree = tree;
    } else {
      work_branch_buffer->branch_buffer->emplace_back(branch_data);
    }

    *branch_tree_handle = work_branch_buffer;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_branch_hash);
  CfdFreeTaprootScriptTreeHandle(handle, work_branch_buffer);
  return result;
}